

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFloatStateQueryTests.cpp
# Opt level: O0

void __thiscall deqp::gles2::Functional::anon_unknown_2::DepthRangeCase::test(DepthRangeCase *this)

{
  float n_00;
  float f_00;
  GLfloat f;
  GLfloat n;
  int i;
  int numIterations;
  int ndx;
  FixedTest fixedTests [4];
  undefined1 local_20 [8];
  Random rnd;
  DepthRangeCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  de::Random::Random((Random *)local_20,0xabcdef);
  (*this->m_verifier->_vptr_StateVerifier[4])
            (0,0x3f800000,this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb70);
  ApiCase::expectError(&this->super_ApiCase,0);
  _numIterations = 0x3f8000003f000000;
  fixedTests[0].n = 0.0;
  fixedTests[0].f = 0.5;
  fixedTests[1].n = 0.0;
  fixedTests[1].f = 0.0;
  fixedTests[2].n = 1.0;
  fixedTests[2].f = 1.0;
  for (i = 0; i < 4; i = i + 1) {
    glu::CallLogWrapper::glDepthRangef
              (&(this->super_ApiCase).super_CallLogWrapper,(GLfloat)(&numIterations)[(long)i * 2],
               fixedTests[(long)i + -1].f);
    (*this->m_verifier->_vptr_StateVerifier[4])
              ((&numIterations)[(long)i * 2],fixedTests[(long)i + -1].f,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb70);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  for (f = 0.0; (int)f < 0x78; f = (GLfloat)((int)f + 1)) {
    n_00 = de::Random::getFloat((Random *)local_20,0.0,1.0);
    f_00 = de::Random::getFloat((Random *)local_20,0.0,1.0);
    glu::CallLogWrapper::glDepthRangef(&(this->super_ApiCase).super_CallLogWrapper,n_00,f_00);
    (*this->m_verifier->_vptr_StateVerifier[4])
              (n_00,f_00,this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0xb70);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  de::Random::~Random((Random *)local_20);
  return;
}

Assistant:

void test (void)
	{
		de::Random rnd(0xabcdef);

		m_verifier->verifyFloat2Expanded(m_testCtx, GL_DEPTH_RANGE, 0.0f, 1.0f);
		expectError(GL_NO_ERROR);

		{
			const struct FixedTest
			{
				float n, f;
			} fixedTests[] =
			{
				{ 0.5f, 1.0f },
				{ 0.0f, 0.5f },
				{ 0.0f, 0.0f },
				{ 1.0f, 1.0f }
			};
			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(fixedTests); ++ndx)
			{
				glDepthRangef(fixedTests[ndx].n, fixedTests[ndx].f);

				m_verifier->verifyFloat2Expanded(m_testCtx, GL_DEPTH_RANGE, fixedTests[ndx].n, fixedTests[ndx].f);
				expectError(GL_NO_ERROR);
			}
		}

		{
			const int numIterations = 120;
			for (int i = 0; i < numIterations; ++i)
			{
				GLfloat n	= rnd.getFloat(0, 1);
				GLfloat f	= rnd.getFloat(0, 1);

				glDepthRangef(n, f);
				m_verifier->verifyFloat2Expanded(m_testCtx, GL_DEPTH_RANGE, n, f);
				expectError(GL_NO_ERROR);
			}
		}
	}